

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

void __thiscall Centaurus::LookaheadDFA<char>::minimize(LookaheadDFA<char> *this)

{
  iterator iVar1;
  pointer pLVar2;
  pointer pLVar3;
  int index;
  ulong uVar4;
  reference rVar5;
  int local_a4;
  vector<int,_std::allocator<int>_> remap;
  vector<bool,_std::allocator<bool>_> mask;
  unordered_map<Centaurus::LDFAState<char>,_int,_std::hash<Centaurus::LDFAState<char>_>,_std::equal_to<Centaurus::LDFAState<char>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<char>,_int>_>_>
  equiv_map;
  
  equiv_map._M_h._M_buckets = (__buckets_ptr)CONCAT71(equiv_map._M_h._M_buckets._1_7_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&mask,((long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                          super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                         super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x50,(bool *)&equiv_map,
             (allocator_type *)&remap);
  equiv_map._M_h._M_buckets = (__buckets_ptr)CONCAT44(equiv_map._M_h._M_buckets._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            (&remap,((long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                           super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                          super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50,(value_type *)&equiv_map
             ,(allocator_type *)&local_a4);
  equiv_map._M_h._M_buckets = &equiv_map._M_h._M_single_bucket;
  equiv_map._M_h._M_bucket_count = 1;
  equiv_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  equiv_map._M_h._M_element_count = 0;
  equiv_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  equiv_map._M_h._M_rehash_policy._M_next_resize = 0;
  equiv_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a4 = 0;
  while( true ) {
    pLVar2 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar3 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)pLVar2 - (long)pLVar3) / 0x50) <= (ulong)(long)local_a4) break;
    iVar1 = std::
            _Hashtable<Centaurus::LDFAState<char>,_std::pair<const_Centaurus::LDFAState<char>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<char>_>,_std::hash<Centaurus::LDFAState<char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&equiv_map._M_h,pLVar3 + local_a4);
    if (iVar1.super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<char>,_int>,_true>.
        _M_cur == (__node_type *)0x0) {
      std::
      _Hashtable<Centaurus::LDFAState<char>,std::pair<Centaurus::LDFAState<char>const,int>,std::allocator<std::pair<Centaurus::LDFAState<char>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::LDFAState<char>>,std::hash<Centaurus::LDFAState<char>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<Centaurus::LDFAState<char>&,int&>
                ((_Hashtable<Centaurus::LDFAState<char>,std::pair<Centaurus::LDFAState<char>const,int>,std::allocator<std::pair<Centaurus::LDFAState<char>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::LDFAState<char>>,std::hash<Centaurus::LDFAState<char>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&equiv_map._M_h,
                 (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_a4,&local_a4);
    }
    else {
      remap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [local_a4] = *(int *)((long)iVar1.
                                  super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<char>,_int>,_true>
                                  ._M_cur + 0x58);
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&mask,(long)local_a4);
      *rVar5._M_p = *rVar5._M_p & ~rVar5._M_mask;
    }
    local_a4 = local_a4 + 1;
  }
  for (uVar4 = 0; uVar4 < (ulong)(((long)pLVar2 - (long)pLVar3) / 0x50); uVar4 = uVar4 + 1) {
    if (-1 < remap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4]) {
      redirect_transitions
                (this,(int)uVar4,
                 remap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar4]);
      pLVar3 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
               super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar2 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
               super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  filter_nodes(this,&mask);
  std::
  _Hashtable<Centaurus::LDFAState<char>,_std::pair<const_Centaurus::LDFAState<char>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<char>_>,_std::hash<Centaurus::LDFAState<char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&equiv_map._M_h);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&remap.super__Vector_base<int,_std::allocator<int>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&mask.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

void minimize()
    {
        std::vector<bool> mask(m_states.size(), true);
        std::vector<int> remap(m_states.size(), -1);

        std::unordered_map<LDFAState<TCHAR>, int> equiv_map;

        for (int index = 0; index < m_states.size(); index++)
        {
            auto p = equiv_map.find(m_states[index]);
            if (p != equiv_map.end())
            {
                remap[index] = p->second;
                mask[index] = false;
            }
            else
            {
                equiv_map.emplace(m_states[index], index);
            }
        }

        for (int index = 0; index < m_states.size(); index++)
        {
            if (remap[index] >= 0)
            {
                redirect_transitions(index, remap[index]);
            }
        }
        filter_nodes(mask);
    }